

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

HierarchyCPT * __thiscall
despot::Parser::CreateHierarchyStateTransition(Parser *this,TiXmlElement *e_CondProb)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
  *this_00;
  NamedVar *pNVar1;
  double dVar2;
  Parser *this_01;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  bool condition;
  int iVar6;
  uint uVar7;
  TiXmlNode *pTVar8;
  mapped_type *ppVVar9;
  HierarchyCPT *this_02;
  TiXmlElement *pTVar10;
  char *__s;
  TiXmlElement *base;
  ulong uVar11;
  int i;
  long lVar12;
  int i_1;
  long lVar13;
  pointer pbVar14;
  allocator<char> local_291;
  Parser *local_290;
  TiXmlElement *local_288;
  TiXmlElement *local_280;
  string parent_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string local_240;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_220;
  vector<double,_std::allocator<double>_> values;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_1a0;
  string name;
  string local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_88;
  string local_70;
  string local_50;
  
  local_288 = e_CondProb;
  GetFirstChildText_abi_cxx11_(&name,this,e_CondProb,"Var");
  std::__cxx11::string::string((string *)&local_108,(string *)&name);
  local_220 = &this->curr_state_vars_;
  local_290 = this;
  bVar4 = Variable::IsVariableName(&local_108,local_220);
  std::operator+(&parent_name,"In <StateTransitionFunction>: Var ",&name);
  std::operator+(&local_128,&parent_name,
                 " has not been declared as a StateVar vnameCurr within the <Variable> tag.");
  pTVar8 = util::tinyxml::TiXmlNode::FirstChild(&local_288->super_TiXmlNode,"Var");
  this_01 = local_290;
  Ensure(local_290,bVar4,&local_128,&pTVar8->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&parent_name);
  std::__cxx11::string::~string((string *)&local_108);
  this_00 = &this_01->variables_;
  ppVVar9 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](this_00,&name);
  pNVar1 = (NamedVar *)*ppVVar9;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetFirstChildText_abi_cxx11_(&parent_name,this_01,local_288,"Parent");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240," ",(allocator<char> *)&tokens);
  Tokenize(&parent_names,&parent_name,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&parent_name);
  local_280 = (TiXmlElement *)&this_01->prev_state_vars_;
  lVar12 = 0;
  uVar11 = 0;
  do {
    if ((ulong)((long)parent_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)parent_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar11) {
      this_02 = (HierarchyCPT *)operator_new(0x70);
      std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
                ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_1a0,
                 &parents);
      HierarchyCPT::HierarchyCPT
                (this_02,pNVar1,
                 (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_1a0);
      std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
                (&local_1a0);
      pTVar10 = util::tinyxml::TiXmlNode::FirstChildElement
                          (&local_288->super_TiXmlNode,"Dependency");
      pTVar10 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"Vars");
      while (pTVar10 != (TiXmlElement *)0x0) {
        __s = util::tinyxml::TiXmlElement::GetText(pTVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&parent_name,__s,(allocator<char> *)&values);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240," ",(allocator<char> *)&value_tokens);
        Tokenize(&tokens,&parent_name,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&parent_name);
        pNVar1 = *parents.
                  super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        local_280 = pTVar10;
        iVar6 = Variable::IndexOf(&pNVar1->super_Variable,&local_50);
        local_220 = (vector<despot::StateVar,_std::allocator<despot::StateVar>_> *)
                    CONCAT44(local_220._4_4_,iVar6);
        std::__cxx11::string::~string((string *)&local_50);
        parent_name.field_2._M_allocated_capacity = 0;
        parent_name._M_dataplus._M_p = (pointer)0x0;
        parent_name._M_string_length = 0;
        lVar12 = 0x20;
        for (uVar11 = 1;
            uVar11 < (ulong)((long)tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)tokens.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar11 = uVar11 + 1) {
          ppVVar9 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                    ::operator[](this_00,(key_type *)
                                         ((long)&((tokens.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar12));
          local_240._M_dataplus._M_p = (pointer)*ppVVar9;
          std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
          emplace_back<despot::NamedVar*>
                    ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&parent_name,
                     (NamedVar **)&local_240);
          lVar12 = lVar12 + 0x20;
        }
        std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
                  ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_88,
                   (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&parent_name);
        pTVar10 = local_280;
        HierarchyCPT::SetParents
                  (this_02,(int)local_220,
                   (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_88);
        std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
                  (&local_88);
        pTVar10 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar10->super_TiXmlNode);
        std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
                  ((_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)
                   &parent_name);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tokens);
      }
      pTVar10 = GetParameterElement(local_290,local_288);
      pTVar10 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"Entry");
      while( true ) {
        if (pTVar10 == (TiXmlElement *)0x0) break;
        GetFirstChildText_abi_cxx11_(&parent_name,local_290,pTVar10,"Instance");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_240," ",(allocator<char> *)&values);
        Tokenize(&tokens,&parent_name,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&parent_name);
        values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        GetFirstChildText_abi_cxx11_(&parent_name,local_290,pTVar10,"ProbTable");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_240," ",&local_291);
        Tokenize(&value_tokens,&parent_name,&local_240);
        local_280 = pTVar10;
        std::__cxx11::string::~string((string *)&local_240);
        std::vector<double,_std::allocator<double>_>::resize
                  (&values,(long)value_tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)value_tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
        pdVar3 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = (long)value_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)value_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        pbVar14 = value_tokens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (lVar13 = 0; lVar12 >> 5 != lVar13; lVar13 = lVar13 + 1) {
          dVar2 = atof((pbVar14->_M_dataplus)._M_p);
          pdVar3[lVar13] = dVar2;
          pbVar14 = pbVar14 + 1;
        }
        pNVar1 = *parents.
                  super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string
                  ((string *)&local_70,
                   (string *)
                   tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        uVar7 = Variable::IndexOf(&pNVar1->super_Variable,&local_70);
        pTVar10 = local_280;
        std::__cxx11::string::~string((string *)&local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&tokens,(const_iterator)
                        tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        iVar6 = (*(this_02->super_CPT).super_Function._vptr_Function[0x12])
                          (this_02,(ulong)uVar7,&tokens,&values);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"In <StateTransitionFunction>: Value assignment failed.",
                   (allocator<char> *)&local_240);
        base = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar10->super_TiXmlNode,"Instance");
        Ensure(local_290,SUB41(iVar6,0),&local_e8,(TiXmlBase *)base);
        std::__cxx11::string::~string((string *)&local_e8);
        pTVar10 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar10->super_TiXmlNode);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&value_tokens);
        std::__cxx11::string::~string((string *)&parent_name);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&values.super__Vector_base<double,_std::allocator<double>_>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tokens);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parent_names);
      std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
                (&parents.
                  super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>);
      std::__cxx11::string::~string((string *)&name);
      return this_02;
    }
    std::__cxx11::string::string
              ((string *)&parent_name,
               (string *)
               ((long)&((parent_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12));
    std::__cxx11::string::string((string *)&local_a8,(string *)&parent_name);
    bVar4 = Variable::IsVariableName
                      (&local_a8,
                       (vector<despot::StateVar,_std::allocator<despot::StateVar>_> *)local_280);
    condition = true;
    if (bVar4) {
LAB_0015de16:
      bVar5 = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_148,(string *)&parent_name);
      bVar5 = Variable::IsVariableName(&local_148,local_220);
      if (bVar5) goto LAB_0015de16;
      std::__cxx11::string::string((string *)&local_168,(string *)&parent_name);
      condition = Variable::IsVariableName(&local_168,&this_01->action_vars_);
      bVar5 = true;
    }
    std::operator+(&local_240,"In <StateTransitionFunction>: Parent ",&parent_name);
    std::operator+(&local_c8,&local_240,
                   " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag."
                  );
    pTVar8 = util::tinyxml::TiXmlNode::FirstChild(&local_288->super_TiXmlNode,"Parent");
    Ensure(local_290,condition,&local_c8,&pTVar8->super_TiXmlBase);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_240);
    if (bVar5) {
      std::__cxx11::string::~string((string *)&local_168);
    }
    if (!bVar4) {
      std::__cxx11::string::~string((string *)&local_148);
    }
    std::__cxx11::string::~string((string *)&local_a8);
    ppVVar9 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](this_00,&parent_name);
    local_240._M_dataplus._M_p = (pointer)*ppVVar9;
    std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
    emplace_back<despot::NamedVar*>
              ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&parents,
               (NamedVar **)&local_240);
    std::__cxx11::string::~string((string *)&parent_name);
    uVar11 = uVar11 + 1;
    lVar12 = lVar12 + 0x20;
  } while( true );
}

Assistant:

HierarchyCPT* Parser::CreateHierarchyStateTransition(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, curr_state_vars_),
		"In <StateTransitionFunction>: Var " + name
			+ " has not been declared as a StateVar vnameCurr within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	StateVar* child = static_cast<StateVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, prev_state_vars_)
				|| Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <StateTransitionFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	HierarchyCPT* func = new HierarchyCPT(child, parents);

	TiXmlElement* e_Dependency = GetFirstChildElement(e_CondProb, "Dependency");
	TiXmlElement* e_Vars = GetFirstChildElement(e_Dependency, "Vars");
	while (e_Vars != NULL) {
		vector<string> tokens = Tokenize(e_Vars->GetText());
		int val = parents[0]->IndexOf(tokens[0]);
		vector<NamedVar*> vars;
		for (int i = 1; i < tokens.size(); i++)
			vars.push_back(static_cast<NamedVar*>(variables_[tokens[i]]));
		func->SetParents(val, vars);

		e_Vars = e_Vars->NextSiblingElement();
	}

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		vector<string> value_tokens = Tokenize(table);

		values.resize(value_tokens.size());
		for (int i = 0; i < value_tokens.size(); i++) {
			values[i] = atof(value_tokens[i].c_str());
		}

		int val = parents[0]->IndexOf(instance[0]);
		instance.erase(instance.begin());
		bool success = func->SetValue(val, instance, values);

		Ensure(success,
			"In <StateTransitionFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}